

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O0

void aom_highbd_filter_block1d8_h4_avx2
               (uint16_t *src_ptr,ptrdiff_t src_pitch,uint16_t *dst_ptr,ptrdiff_t dst_pitch,
               uint32_t height,int16_t *filter,int bd)

{
  undefined8 *puVar1;
  undefined1 (*pauVar2) [32];
  undefined1 (*pauVar3) [32];
  undefined1 (*pauVar4) [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  uint uVar15;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined1 auVar16 [16];
  undefined1 auVar19 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar20 [16];
  int in_stack_00000008;
  __m256i res_1;
  __m256i r0_1;
  __m256i row0_1;
  __m256i row0_0;
  __m256i res;
  __m256i res_odd;
  __m256i res_even;
  __m256i r1;
  __m256i r0;
  __m256i row1;
  __m256i row0;
  __m256i ip_mask_f4f5;
  __m256i ip_mask_f2f3;
  __m256i mask;
  __m256i zero;
  __m256i clip_pixel;
  uint32_t i;
  __m256i s [2];
  __m256i ff [2];
  __m256i rounding;
  undefined4 local_8e8;
  undefined8 local_8e0;
  undefined8 *puStackY_8c8;
  undefined8 uStack_8b0;
  undefined1 local_8c0 [32];
  undefined8 uStack_8a8;
  __m256i *in_stack_fffffffffffff768;
  __m256i *in_stack_fffffffffffff770;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  uint local_6c4;
  undefined8 uStack_630;
  undefined8 uStack_628;
  ulong uStack_5d8;
  undefined8 local_2b0;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  
  auVar19 = vpinsrd_avx(ZEXT416(0x40),0x40,1);
  auVar19 = vpinsrd_avx(auVar19,0x40,2);
  auVar19 = vpinsrd_avx(auVar19,0x40,3);
  auVar16 = vpinsrd_avx(ZEXT416(0x40),0x40,1);
  auVar16 = vpinsrd_avx(auVar16,0x40,2);
  auVar16 = vpinsrd_avx(auVar16,0x40,3);
  auVar16 = ZEXT116(0) * auVar19 + ZEXT116(1) * auVar16;
  auVar19 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar19;
  if (in_stack_00000008 == 10) {
    local_8e8 = 0x3ff;
  }
  else {
    local_8e8 = 0xff;
    if (in_stack_00000008 == 0xc) {
      local_8e8 = 0xfff;
    }
  }
  auVar5 = vpinsrw_avx(ZEXT216((ushort)local_8e8),local_8e8,1);
  auVar5 = vpinsrw_avx(auVar5,local_8e8,2);
  auVar5 = vpinsrw_avx(auVar5,local_8e8,3);
  auVar5 = vpinsrw_avx(auVar5,local_8e8,4);
  auVar5 = vpinsrw_avx(auVar5,local_8e8,5);
  auVar5 = vpinsrw_avx(auVar5,local_8e8,6);
  auVar5 = vpinsrw_avx(auVar5,local_8e8,7);
  auVar20 = vpinsrw_avx(ZEXT216((ushort)local_8e8),local_8e8,1);
  auVar20 = vpinsrw_avx(auVar20,local_8e8,2);
  auVar20 = vpinsrw_avx(auVar20,local_8e8,3);
  auVar20 = vpinsrw_avx(auVar20,local_8e8,4);
  auVar20 = vpinsrw_avx(auVar20,local_8e8,5);
  auVar20 = vpinsrw_avx(auVar20,local_8e8,6);
  auVar20 = vpinsrw_avx(auVar20,local_8e8,7);
  uStack_1f0 = auVar20._0_8_;
  uStack_1e8 = auVar20._8_8_;
  uStack_5d8 = SUB328(ZEXT832(0),4);
  pack_filters_4tap(local_8c0._8_8_,local_8c0._0_8_);
  local_6c4 = 0;
  while( true ) {
    uStack_630 = auVar19._0_8_;
    uStack_628 = auVar19._8_8_;
    if (in_R8D - 2 < local_6c4) break;
    pauVar2 = (undefined1 (*) [32])(in_RDI + -2 + (ulong)local_6c4 * in_RSI * 2);
    pauVar3 = (undefined1 (*) [32])(in_RDI + -2 + (ulong)(local_6c4 + 1) * in_RSI * 2);
    auVar20 = *(undefined1 (*) [16])*pauVar3;
    auVar17._0_16_ = ZEXT116(0) * auVar20 + ZEXT116(1) * SUB2416(*(undefined1 (*) [24])*pauVar2,0);
    auVar17._16_16_ = ZEXT116(0) * SUB3216(*pauVar2,0x10) + ZEXT116(1) * auVar20;
    auVar7 = vperm2i128_avx2(*pauVar2,*pauVar3,0x31);
    auVar18 = vpalignr_avx2(auVar7,auVar17,4);
    convolve_4tap(in_stack_fffffffffffff770,in_stack_fffffffffffff768);
    auVar9._16_8_ = uStack_630;
    auVar9._0_16_ = auVar16;
    auVar9._24_8_ = uStack_628;
    auVar18 = vpaddd_avx2(auVar18,auVar9);
    auVar6 = vpsrad_avx2(auVar18,ZEXT416(7));
    vpalignr_avx2(auVar7,auVar17,2);
    auVar18 = vpalignr_avx2(auVar7,auVar17,6);
    convolve_4tap(in_stack_fffffffffffff770,in_stack_fffffffffffff768);
    auVar8._16_8_ = uStack_630;
    auVar8._0_16_ = auVar16;
    auVar8._24_8_ = uStack_628;
    auVar18 = vpaddd_avx2(auVar18,auVar8);
    auVar18 = vpsrad_avx2(auVar18,ZEXT416(7));
    auVar18 = vpackssdw_avx2(auVar6,auVar18);
    auVar14[8] = '\x04';
    auVar14[9] = '\x05';
    auVar14[10] = '\f';
    auVar14[0xb] = '\r';
    auVar14[0xc] = '\x06';
    auVar14[0xd] = '\a';
    auVar14[0xe] = '\x0e';
    auVar14[0xf] = '\x0f';
    auVar14[0] = '\0';
    auVar14[1] = '\x01';
    auVar14[2] = '\b';
    auVar14[3] = '\t';
    auVar14[4] = '\x02';
    auVar14[5] = '\x03';
    auVar14[6] = '\n';
    auVar14[7] = '\v';
    auVar14[0x10] = '\0';
    auVar14[0x11] = '\x01';
    auVar14[0x12] = '\b';
    auVar14[0x13] = '\t';
    auVar14[0x14] = '\x02';
    auVar14[0x15] = '\x03';
    auVar14[0x16] = '\n';
    auVar14[0x17] = '\v';
    auVar14[0x18] = '\x04';
    auVar14[0x19] = '\x05';
    auVar14[0x1a] = '\f';
    auVar14[0x1b] = '\r';
    auVar14[0x1c] = '\x06';
    auVar14[0x1d] = '\a';
    auVar14[0x1e] = '\x0e';
    auVar14[0x1f] = '\x0f';
    auVar18 = vpshufb_avx2(auVar18,auVar14);
    auVar10._16_8_ = uStack_1f0;
    auVar10._0_16_ = auVar5;
    auVar10._24_8_ = uStack_1e8;
    auVar18 = vpminsw_avx2(auVar18,auVar10);
    auVar18 = vpmaxsw_avx2(auVar18,ZEXT832(uStack_5d8) << 0x40);
    puVar1 = (undefined8 *)(in_RDX + (ulong)local_6c4 * in_RCX * 2);
    local_860 = auVar18._0_8_;
    uStack_858 = auVar18._8_8_;
    uStack_850 = auVar18._16_8_;
    uStack_848 = auVar18._24_8_;
    *puVar1 = local_860;
    puVar1[1] = uStack_858;
    puVar1 = (undefined8 *)(in_RDX + ((ulong)local_6c4 * in_RCX + in_RCX) * 2);
    *puVar1 = uStack_850;
    puVar1[1] = uStack_848;
    local_6c4 = local_6c4 + 2;
  }
  if ((in_R8D & 1) != 0) {
    uVar15 = in_R8D - 1;
    pauVar2 = (undefined1 (*) [32])(in_RDI + -2 + (ulong)uVar15 * in_RSI * 2);
    pauVar4 = (undefined1 (*) [16])(in_RDI + 6 + (ulong)uVar15 * in_RSI * 2);
    auVar19 = ZEXT116(0) * *pauVar4 + ZEXT116(1) * SUB2416(*(undefined1 (*) [24])*pauVar2,0);
    auVar20 = ZEXT116(0) * SUB3216(*pauVar2,0x10) + ZEXT116(1) * *pauVar4;
    uStack_8b0 = auVar20._0_8_;
    uStack_8a8 = auVar20._8_8_;
    auVar13._16_8_ = uStack_8b0;
    auVar13._0_16_ = auVar19;
    auVar13._24_8_ = uStack_8a8;
    auVar12[8] = '\x04';
    auVar12[9] = '\x05';
    auVar12[10] = '\x06';
    auVar12[0xb] = '\a';
    auVar12[0xc] = '\x06';
    auVar12[0xd] = '\a';
    auVar12[0xe] = '\b';
    auVar12[0xf] = '\t';
    auVar12[0] = '\0';
    auVar12[1] = '\x01';
    auVar12[2] = '\x02';
    auVar12[3] = '\x03';
    auVar12[4] = '\x02';
    auVar12[5] = '\x03';
    auVar12[6] = '\x04';
    auVar12[7] = '\x05';
    auVar12[0x10] = '\0';
    auVar12[0x11] = '\x01';
    auVar12[0x12] = '\x02';
    auVar12[0x13] = '\x03';
    auVar12[0x14] = '\x02';
    auVar12[0x15] = '\x03';
    auVar12[0x16] = '\x04';
    auVar12[0x17] = '\x05';
    auVar12[0x18] = '\x04';
    auVar12[0x19] = '\x05';
    auVar12[0x1a] = '\x06';
    auVar12[0x1b] = '\a';
    auVar12[0x1c] = '\x06';
    auVar12[0x1d] = '\a';
    auVar12[0x1e] = '\b';
    auVar12[0x1f] = '\t';
    vpshufb_avx2(auVar13,auVar12);
    auVar11._16_8_ = uStack_8b0;
    auVar11._0_16_ = auVar19;
    auVar11._24_8_ = uStack_8a8;
    auVar18[8] = '\b';
    auVar18[9] = '\t';
    auVar18[10] = '\n';
    auVar18[0xb] = '\v';
    auVar18[0xc] = '\n';
    auVar18[0xd] = '\v';
    auVar18[0xe] = '\f';
    auVar18[0xf] = '\r';
    auVar18[0] = '\x04';
    auVar18[1] = '\x05';
    auVar18[2] = '\x06';
    auVar18[3] = '\a';
    auVar18[4] = '\x06';
    auVar18[5] = '\a';
    auVar18[6] = '\b';
    auVar18[7] = '\t';
    auVar18[0x10] = '\x04';
    auVar18[0x11] = '\x05';
    auVar18[0x12] = '\x06';
    auVar18[0x13] = '\a';
    auVar18[0x14] = '\x06';
    auVar18[0x15] = '\a';
    auVar18[0x16] = '\b';
    auVar18[0x17] = '\t';
    auVar18[0x18] = '\b';
    auVar18[0x19] = '\t';
    auVar18[0x1a] = '\n';
    auVar18[0x1b] = '\v';
    auVar18[0x1c] = '\n';
    auVar18[0x1d] = '\v';
    auVar18[0x1e] = '\f';
    auVar18[0x1f] = '\r';
    auVar18 = vpshufb_avx2(auVar11,auVar18);
    convolve_4tap(*(__m256i **)pauVar4[1],*(__m256i **)(*pauVar4 + 8));
    auVar6._16_8_ = uStack_630;
    auVar6._0_16_ = auVar16;
    auVar6._24_8_ = uStack_628;
    auVar18 = vpaddd_avx2(auVar18,auVar6);
    auVar18 = vpsrad_avx2(auVar18,ZEXT416(7));
    auVar18 = vpackssdw_avx2(auVar18,auVar18);
    auVar7._16_8_ = uStack_1f0;
    auVar7._0_16_ = auVar5;
    auVar7._24_8_ = uStack_1e8;
    auVar18 = vpminsw_avx2(auVar18,auVar7);
    auVar18 = vpmaxsw_avx2(auVar18,ZEXT832(uStack_5d8) << 0x40);
    local_8e0 = auVar18._0_8_;
    *(undefined8 *)(in_RDX + (ulong)uVar15 * in_RCX * 2) = local_8e0;
    puStackY_8c8 = auVar18._24_8_;
    *puStackY_8c8 = local_2b0;
  }
  return;
}

Assistant:

static void aom_highbd_filter_block1d8_h4_avx2(
    const uint16_t *src_ptr, ptrdiff_t src_pitch, uint16_t *dst_ptr,
    ptrdiff_t dst_pitch, uint32_t height, const int16_t *filter, int bd) {
  const __m256i rounding = _mm256_set1_epi32(1 << (CONV8_ROUNDING_BITS - 1));
  __m256i ff[2], s[2];
  uint32_t i = 0;
  const __m256i clip_pixel =
      _mm256_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m256i zero = _mm256_setzero_si256();

  static const uint8_t shuffle_mask[32] = { 0, 1, 8,  9,  2, 3, 10, 11,
                                            4, 5, 12, 13, 6, 7, 14, 15,
                                            0, 1, 8,  9,  2, 3, 10, 11,
                                            4, 5, 12, 13, 6, 7, 14, 15 };

  __m256i mask = _mm256_loadu_si256((__m256i *)shuffle_mask);
  __m256i ip_mask_f2f3 = _mm256_loadu_si256((__m256i *)ip_shuffle_f2f3);
  __m256i ip_mask_f4f5 = _mm256_loadu_si256((__m256i *)ip_shuffle_f4f5);

  pack_filters_4tap(filter, ff);
  src_ptr -= 3;

  /* Horizontal filter */

  for (i = 0; i <= (height - 2); i += 2) {
    const __m256i row0 =
        _mm256_loadu_si256((__m256i *)&src_ptr[i * src_pitch + 2]);
    __m256i row1 =
        _mm256_loadu_si256((__m256i *)&src_ptr[(i + 1) * src_pitch + 2]);

    const __m256i r0 =
        _mm256_inserti128_si256(row0, _mm256_castsi256_si128(row1), 1);
    const __m256i r1 = _mm256_permute2x128_si256(row0, row1, 0x31);

    // even pixels
    s[0] = r0;
    s[1] = _mm256_alignr_epi8(r1, r0, 4);

    __m256i res_even = convolve_4tap(s, ff);
    res_even = _mm256_srai_epi32(_mm256_add_epi32(res_even, rounding),
                                 CONV8_ROUNDING_BITS);

    // odd pixels
    s[0] = _mm256_alignr_epi8(r1, r0, 2);
    s[1] = _mm256_alignr_epi8(r1, r0, 6);

    __m256i res_odd = convolve_4tap(s, ff);
    res_odd = _mm256_srai_epi32(_mm256_add_epi32(res_odd, rounding),
                                CONV8_ROUNDING_BITS);

    __m256i res = _mm256_packs_epi32(res_even, res_odd);
    res = _mm256_shuffle_epi8(res, mask);

    res = _mm256_min_epi16(res, clip_pixel);
    res = _mm256_max_epi16(res, zero);

    _mm_storeu_si128((__m128i *)&dst_ptr[i * dst_pitch],
                     _mm256_castsi256_si128(res));
    _mm_storeu_si128((__m128i *)&dst_ptr[i * dst_pitch + dst_pitch],
                     _mm256_extracti128_si256(res, 1));
  }

  if (height % 2 != 0) {
    i = height - 1;
    const __m256i row0_0 =
        _mm256_loadu_si256((__m256i *)&src_ptr[i * src_pitch + 2]);
    const __m256i row0_1 =
        _mm256_loadu_si256((__m256i *)&src_ptr[i * src_pitch + 6]);

    const __m256i r0 =
        _mm256_inserti128_si256(row0_0, _mm256_castsi256_si128(row0_1), 1);

    s[0] = _mm256_shuffle_epi8(r0, ip_mask_f2f3);
    s[1] = _mm256_shuffle_epi8(r0, ip_mask_f4f5);

    __m256i res = convolve_4tap(s, ff);
    res =
        _mm256_srai_epi32(_mm256_add_epi32(res, rounding), CONV8_ROUNDING_BITS);

    res = _mm256_packs_epi32(res, res);
    res = _mm256_min_epi16(res, clip_pixel);
    res = _mm256_max_epi16(res, zero);

    _mm_storel_epi64((__m128i *)&dst_ptr[i * dst_pitch],
                     _mm256_castsi256_si128(res));
    _mm_storel_epi64((__m128i *)&dst_ptr[i * dst_pitch + 4],
                     _mm256_extracti128_si256(res, 1));
  }
}